

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.h
# Opt level: O2

Library * __thiscall
Assimp::Blender::Structure::_allocate<Assimp::Blender::Library>
          (Structure *this,shared_ptr<Assimp::Blender::Library> *out,size_t *s)

{
  Library *__p;
  __shared_ptr<Assimp::Blender::Library,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  __p = (Library *)operator_new(0x618);
  memset(__p,0,0x610);
  (__p->super_ElemBase)._vptr_ElemBase = (_func_int **)&PTR__Library_00734720;
  (__p->id).super_ElemBase._vptr_ElemBase = (_func_int **)&PTR__ElemBase_00733df0;
  (__p->parent).super___shared_ptr<Assimp::Blender::Library,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->parent).super___shared_ptr<Assimp::Blender::Library,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::__shared_ptr<Assimp::Blender::Library,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Assimp::Blender::Library,void>
            ((__shared_ptr<Assimp::Blender::Library,(__gnu_cxx::_Lock_policy)2> *)&local_30,__p);
  ::std::__shared_ptr<Assimp::Blender::Library,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&out->super___shared_ptr<Assimp::Blender::Library,_(__gnu_cxx::_Lock_policy)2>,
             &local_30);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  *s = 1;
  return (out->super___shared_ptr<Assimp::Blender::Library,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
}

Assistant:

T* _allocate(std::shared_ptr<T>& out, size_t& s) const {
        out = std::shared_ptr<T>(new T());
        s = 1;
        return out.get();
    }